

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
               (int field_number,MessageLite *value,CodedOutputStream *output)

{
  undefined8 in_RDX;
  uint32 value_00;
  CodedOutputStream *in_RSI;
  int in_EDI;
  int size;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  uint32 value_01;
  undefined4 in_stack_ffffffffffffffe8;
  uint32 size_00;
  
  value_00 = (uint32)((ulong)in_RDX >> 0x20);
  value_01 = value_00;
  size_00 = value_00;
  MakeTag(in_EDI,WIRETYPE_LENGTH_DELIMITED);
  io::CodedOutputStream::WriteTag
            ((CodedOutputStream *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             value_00);
  (**(code **)((in_RSI->impl_).end_ + 0x60))();
  io::CodedOutputStream::WriteVarint32(in_RSI,value_01);
  WriteSubMessageMaybeToArray
            (size_00,(MessageLite *)CONCAT44(in_EDI,in_stack_ffffffffffffffe8),in_RSI);
  return;
}

Assistant:

void WireFormatLite::WriteMessageMaybeToArray(int field_number,
                                              const MessageLite& value,
                                              io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  const int size = value.GetCachedSize();
  output->WriteVarint32(size);
  WriteSubMessageMaybeToArray(size, value, output);
}